

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall QPainter::setBrush(QPainter *this,QColor color)

{
  QColor color_00;
  bool bVar1;
  QPainterPrivate *rhs;
  pointer pQVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QPainterPrivate *d;
  QColor actualColor;
  undefined4 uVar3;
  int line;
  undefined4 in_stack_ffffffffffffffa8;
  GlobalColor in_stack_ffffffffffffffac;
  QColor *in_stack_ffffffffffffffb0;
  QColor local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (undefined4)in_RDI;
  line = (int)((ulong)in_RDI >> 0x20);
  rhs = d_func((QPainter *)0x59873f);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x598753);
  if (bVar1) {
    bVar1 = QColor::isValid(&local_18);
    if (!bVar1) {
      QColor::QColor(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
              ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x5987dc);
    bVar1 = ::operator==((QBrush *)CONCAT44(line,uVar3),(QColor *)rhs);
    if (!bVar1) {
      std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x598816);
      color_00.ct._0_4_ = line;
      color_00.cspec = uVar3;
      color_00.ct._4_4_ = in_stack_ffffffffffffffa8;
      color_00._12_4_ = in_stack_ffffffffffffffac;
      QBrush::operator=((QBrush *)rhs,color_00);
      if (rhs->extended == (QPaintEngineEx *)0x0) {
        pQVar2 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                           ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                            0x59885d);
        QFlags<QPaintEngine::DirtyFlag>::operator|=
                  (&(pQVar2->super_QPaintEngineState).dirtyFlags,DirtyBrush);
      }
      else {
        (*(rhs->extended->super_QPaintEngine)._vptr_QPaintEngine[0x22])();
      }
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffffb0,
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),line,
               (char *)rhs);
    QMessageLogger::warning(&stack0xffffffffffffffa8,"QPainter::setBrush: Painter not active");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainter::setBrush(QColor color)
{
    Q_D(QPainter);
    if (!d->engine) {
        qWarning("QPainter::setBrush: Painter not active");
        return;
    }

    const QColor actualColor = color.isValid() ? color : QColor(Qt::black);
    if (d->state->brush == actualColor)
        return;
    d->state->brush = actualColor;
    if (d->extended)
        d->extended->brushChanged();
    else
        d->state->dirtyFlags |= QPaintEngine::DirtyBrush;
}